

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_clear(nk_context *ctx)

{
  nk_table *pnVar1;
  nk_window *pnVar2;
  nk_table *local_30;
  nk_table *it;
  nk_table *n;
  nk_window *next;
  nk_window *iter;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x3adf,"void nk_clear(struct nk_context *)");
  }
  if (ctx != (nk_context *)0x0) {
    if (ctx->use_pool == 0) {
      nk_buffer_reset(&ctx->memory,NK_BUFFER_FRONT);
    }
    else {
      nk_buffer_clear(&ctx->memory);
    }
    ctx->build = 0;
    (ctx->memory).calls = 0;
    ctx->last_widget_state = 0;
    (ctx->style).cursor_active = (ctx->style).cursors[0];
    nk_memset(&ctx->overlay,0,0x40);
    next = ctx->begin;
    while (next != (nk_window *)0x0) {
      if ((((next->flags & 0x8000) == 0) || ((next->flags & 0x4000) != 0)) ||
         (next->seq != ctx->seq)) {
        if ((((next->flags & 0x2000) != 0) || ((next->flags & 0x4000) != 0)) &&
           (next == ctx->active)) {
          ctx->active = next->prev;
          ctx->end = next->prev;
          if (ctx->end == (nk_window *)0x0) {
            ctx->begin = (nk_window *)0x0;
          }
          if (ctx->active != (nk_window *)0x0) {
            ctx->active->flags = ctx->active->flags & 0xffffefff;
          }
        }
        if (((next->popup).win != (nk_window *)0x0) && (((next->popup).win)->seq != ctx->seq)) {
          nk_free_window(ctx,(next->popup).win);
          (next->popup).win = (nk_window *)0x0;
        }
        pnVar1 = next->tables;
        while (local_30 = pnVar1, local_30 != (nk_table *)0x0) {
          pnVar1 = local_30->next;
          if (local_30->seq != ctx->seq) {
            nk_remove_table(next,local_30);
            nk_zero(local_30,0x1f0);
            nk_free_table(ctx,local_30);
            if (local_30 == next->tables) {
              next->tables = pnVar1;
            }
          }
        }
        if ((next->seq == ctx->seq) && ((next->flags & 0x4000) == 0)) {
          next = next->next;
        }
        else {
          pnVar2 = next->next;
          nk_remove_window(ctx,next);
          nk_free_window(ctx,next);
          next = pnVar2;
        }
      }
      else {
        next = next->next;
      }
    }
    ctx->seq = ctx->seq + 1;
  }
  return;
}

Assistant:

NK_API void
nk_clear(struct nk_context *ctx)
{
    struct nk_window *iter;
    struct nk_window *next;
    NK_ASSERT(ctx);

    if (!ctx) return;
    if (ctx->use_pool)
        nk_buffer_clear(&ctx->memory);
    else nk_buffer_reset(&ctx->memory, NK_BUFFER_FRONT);

    ctx->build = 0;
    ctx->memory.calls = 0;
    ctx->last_widget_state = 0;
    ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_ARROW];
    NK_MEMSET(&ctx->overlay, 0, sizeof(ctx->overlay));

    /* garbage collector */
    iter = ctx->begin;
    while (iter) {
        /* make sure valid minimized windows do not get removed */
        if ((iter->flags & NK_WINDOW_MINIMIZED) &&
            !(iter->flags & NK_WINDOW_CLOSED) &&
            iter->seq == ctx->seq) {
            iter = iter->next;
            continue;
        }
        /* remove hotness from hidden or closed windows*/
        if (((iter->flags & NK_WINDOW_HIDDEN) ||
            (iter->flags & NK_WINDOW_CLOSED)) &&
            iter == ctx->active) {
            ctx->active = iter->prev;
            ctx->end = iter->prev;
            if (!ctx->end)
                ctx->begin = 0;
            if (ctx->active)
                ctx->active->flags &= ~(unsigned)NK_WINDOW_ROM;
        }
        /* free unused popup windows */
        if (iter->popup.win && iter->popup.win->seq != ctx->seq) {
            nk_free_window(ctx, iter->popup.win);
            iter->popup.win = 0;
        }
        /* remove unused window state tables */
        {struct nk_table *n, *it = iter->tables;
        while (it) {
            n = it->next;
            if (it->seq != ctx->seq) {
                nk_remove_table(iter, it);
                nk_zero(it, sizeof(union nk_page_data));
                nk_free_table(ctx, it);
                if (it == iter->tables)
                    iter->tables = n;
            } it = n;
        }}
        /* window itself is not used anymore so free */
        if (iter->seq != ctx->seq || iter->flags & NK_WINDOW_CLOSED) {
            next = iter->next;
            nk_remove_window(ctx, iter);
            nk_free_window(ctx, iter);
            iter = next;
        } else iter = iter->next;
    }
    ctx->seq++;
}